

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg *
fmt::v8::detail::get_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>,int>
          (basic_format_context<fmt::v8::appender,_char> *ctx,int id)

{
  bool bVar1;
  basic_format_context<fmt::v8::appender,_char> *in_RDI;
  format_arg *arg;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  basic_format_context<fmt::v8::appender,_char> *this;
  
  this = in_RDI;
  basic_format_context<fmt::v8::appender,_char>::arg(in_RDI,in_stack_ffffffffffffffdc);
  bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)in_RDI);
  if (!bVar1) {
    basic_format_context<fmt::v8::appender,_char>::on_error
              (this,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return (format_arg *)this;
}

Assistant:

FMT_CONSTEXPR auto get_arg(Context& ctx, ID id) ->
    typename Context::format_arg {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("argument not found");
  return arg;
}